

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O1

void __thiscall Map::Leave(Map *this,Character *character,WarpAnimation animation,bool silent)

{
  Character *other;
  bool bVar1;
  int num;
  _List_iterator<Character_*> __first;
  undefined7 in_register_00000009;
  list<Character_*,_std::allocator<Character_*>_> *__last;
  _List_node_base *p_Var2;
  PacketBuilder builder;
  Character *local_68;
  PacketBuilder local_60;
  
  local_68 = character;
  if ((int)CONCAT71(in_register_00000009,silent) == 0) {
    PacketBuilder::PacketBuilder(&local_60,PACKET_AVATAR,PACKET_REMOVE,3);
    num = Character::PlayerID(local_68);
    PacketBuilder::AddShort(&local_60,num);
    if (animation != WARP_ANIMATION_NONE) {
      PacketBuilder::AddChar(&local_60,(uint)animation);
    }
    p_Var2 = (this->characters).super__List_base<Character_*,_std::allocator<Character_*>_>._M_impl.
             _M_node.super__List_node_base._M_next;
    if (p_Var2 != (_List_node_base *)&this->characters) {
      do {
        other = (Character *)p_Var2[1]._M_next;
        if (other != local_68) {
          bVar1 = Character::InRange(local_68,other);
          if (bVar1) {
            Character::Send(other,&local_60);
          }
        }
        p_Var2 = p_Var2->_M_next;
      } while (p_Var2 != (_List_node_base *)&this->characters);
    }
    PacketBuilder::~PacketBuilder(&local_60);
  }
  __last = &this->characters;
  __first = std::
            __remove_if<std::_List_iterator<Character*>,__gnu_cxx::__ops::_Iter_equals_val<Character*const>>
                      ((this->characters).
                       super__List_base<Character_*,_std::allocator<Character_*>_>._M_impl._M_node.
                       super__List_node_base._M_next,(_List_iterator<Character_*>)__last,
                       (_Iter_equals_val<Character_*const>)&local_68);
  std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::erase
            (__last,(const_iterator)__first._M_node,(const_iterator)__last);
  local_68->map = (Map *)0x0;
  return;
}

Assistant:

void Map::Leave(Character *character, WarpAnimation animation, bool silent)
{
	if (!silent)
	{
		PacketBuilder builder(PACKET_AVATAR, PACKET_REMOVE, 3);
		builder.AddShort(character->PlayerID());

		if (animation != WARP_ANIMATION_NONE)
		{
			builder.AddChar(animation);
		}

		UTIL_FOREACH(this->characters, checkcharacter)
		{
			if (checkcharacter == character || !character->InRange(checkcharacter))
			{
				continue;
			}

			checkcharacter->Send(builder);
		}
	}

	this->characters.erase(
		std::remove(UTIL_RANGE(this->characters), character),
		this->characters.end()
	);

	character->map = 0;
}